

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::iterate(TextureGatherCase *this)

{
  GatherArgs *gatherArgs_00;
  pointer *this_00;
  GatherType GVar1;
  TextureType textureType;
  uint uVar2;
  code *pcVar3;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  bool bVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  deBool dVar8;
  int iVar9;
  TestLog *pTVar10;
  RenderContext *renderCtx_00;
  undefined4 extraout_var;
  ShaderProgram *pSVar12;
  TestError *pTVar13;
  size_type sVar14;
  const_reference data_00;
  MessageBuilder *pMVar15;
  reference vertexArrays;
  string *refZExpr_00;
  IVec2 *offsetRange;
  Vector<float,_3> *local_b00;
  Vector<float,_2> *local_ac8;
  bool local_9a1;
  ConstPixelBufferAccess local_970;
  undefined1 local_948 [8];
  TextureLevel rendered;
  MessageBuilder local_908;
  undefined1 local_788 [8];
  Vec3 texCoordVec_1 [4];
  Vector<float,_2> local_5d8;
  Vec2 texCoordVec [4];
  int viewportSizeUniformLocation;
  int samplerUniformLocation;
  deUint16 indices [6];
  VertexArrayBinding local_578;
  allocator<char> local_521;
  string local_520;
  VertexArrayBinding local_500;
  allocator<char> local_4a9;
  string local_4a8;
  VertexArrayBinding local_488;
  undefined1 local_438 [8];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> attrBindings;
  vector<float,_std::allocator<float>_> texCoord;
  float normalizedCoord [8];
  float position [8];
  string local_3c0;
  MessageBuilder local_3a0;
  DefaultDeleter<glu::ShaderProgram> local_21a;
  undefined1 local_219;
  undefined1 local_218 [216];
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_140;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_130;
  bool local_11b;
  byte local_11a;
  allocator<char> local_119;
  undefined1 local_118 [5];
  bool needNormalizedCoordInShader;
  bool needPixelCoordInShader;
  string refZExpr;
  GatherArgs *gatherArgs;
  Functions *gl;
  RenderContext *renderCtx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ScopedLogSection local_28;
  ScopedLogSection iterationSection;
  TestLog *log;
  TextureGatherCase *this_local;
  long lVar11;
  
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  iterationSection.m_log = pTVar10;
  de::toString<int>(&local_68,&this->m_currentIteration);
  std::operator+(&local_48,"Iteration",&local_68);
  de::toString<int>((string *)&renderCtx,&this->m_currentIteration);
  std::operator+(&local_98,"Iteration ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&renderCtx);
  tcu::ScopedLogSection::ScopedLogSection(&local_28,pTVar10,&local_48,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&renderCtx);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  renderCtx_00 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*renderCtx_00->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            ((undefined1 *)((long)&refZExpr.field_2 + 0xc),this,
             (ulong)(uint)this->m_currentIteration);
  gatherArgs_00 = (GatherArgs *)((long)&refZExpr.field_2 + 0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"v_normalizedCoord.x",&local_119);
  std::allocator<char>::~allocator(&local_119);
  local_11a = this->m_gatherType == GATHERTYPE_OFFSET_DYNAMIC;
  local_9a1 = true;
  if (!(bool)local_11a) {
    local_9a1 = isDepthFormat(&this->m_textureFormat);
  }
  local_11b = local_9a1;
  pSVar12 = (ShaderProgram *)operator_new(0xd0);
  local_219 = 1;
  GVar1 = this->m_gatherType;
  textureType = this->m_textureType;
  getOffsetRange((TextureGatherCase *)local_218);
  offsetRange = (IVec2 *)local_218;
  refZExpr_00 = (string *)local_118;
  genProgramSources((ProgramSources *)(local_218 + 8),this,GVar1,textureType,&this->m_textureFormat,
                    gatherArgs_00,refZExpr_00,offsetRange);
  glu::ShaderProgram::ShaderProgram(pSVar12,renderCtx_00,(ProgramSources *)(local_218 + 8));
  local_219 = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_21a);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_140);
  local_130 = de::details::MovePtr::operator_cast_to_PtrData(&local_140,(MovePtr *)pSVar12);
  data._8_4_ = (int)offsetRange;
  data.ptr = (ShaderProgram *)refZExpr_00;
  data._12_4_ = (int)((ulong)offsetRange >> 0x20);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_program,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_140);
  glu::ProgramSources::~ProgramSources((ProgramSources *)(local_218 + 8));
  if (this->m_currentIteration == 0) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator*(&(this->m_program).
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
    glu::operator<<(pTVar10,pSVar12);
  }
  else {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3a0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_3a0,
                         (char (*) [93])
                         "Using a program similar to the previous one, except with a gather function call as follows:\n"
                        );
    GVar1 = this->m_gatherType;
    getOffsetRange((TextureGatherCase *)(position + 6));
    genGatherFuncCall(&local_3c0,this,GVar1,&this->m_textureFormat,gatherArgs_00,(string *)local_118
                      ,(IVec2 *)(position + 6),0);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_3c0);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_3c0);
    tcu::MessageBuilder::~MessageBuilder(&local_3a0);
  }
  pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  bVar4 = glu::ShaderProgram::isOk(pSVar12);
  if (bVar4) {
    pcVar3 = *(code **)(lVar11 + 0x1a00);
    iVar5 = tcu::Vector<int,_2>::x
                      ((Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
    iVar6 = tcu::Vector<int,_2>::y
                      ((Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
    (*pcVar3)(0,0,iVar5,iVar6);
    (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar11 + 0x188))(0x4000);
    position[2] = 1.0;
    position[3] = -1.0;
    position[4] = 1.0;
    position[5] = 1.0;
    normalizedCoord[6] = -1.0;
    normalizedCoord[7] = -1.0;
    position[0] = -1.0;
    position[1] = 1.0;
    normalizedCoord[2] = 1.0;
    normalizedCoord[3] = 0.0;
    normalizedCoord[4] = 1.0;
    normalizedCoord[5] = 1.0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    normalizedCoord[0] = 0.0;
    normalizedCoord[1] = 1.0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
              (&attrBindings.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
               (ulong)(uint)this->m_currentIteration);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               local_438);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"a_position",&local_4a9)
    ;
    glu::va::Float(&local_488,&local_4a8,2,4,0,normalizedCoord + 6);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               local_438,&local_488);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"a_texCoord",&local_521)
    ;
    this_00 = &attrBindings.
               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar14 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)this_00);
    iVar5 = (int)sVar14;
    if (iVar5 < 0) {
      iVar5 = iVar5 + 3;
    }
    data_00 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)this_00,0);
    glu::va::Float(&local_500,&local_520,iVar5 >> 2,4,0,data_00);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               local_438,&local_500);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_500);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    if ((local_11b & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(indices + 4),"a_normalizedCoord",(allocator<char> *)((long)indices + 7))
      ;
      glu::va::Float(&local_578,(string *)(indices + 4),2,4,0,
                     (float *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
                ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                 local_438,&local_578);
      glu::VertexArrayBinding::~VertexArrayBinding(&local_578);
      std::__cxx11::string::~string((string *)(indices + 4));
      std::allocator<char>::~allocator((allocator<char> *)((long)indices + 7));
    }
    _viewportSizeUniformLocation = 0x2000200010000;
    indices[0] = 1;
    indices[1] = 3;
    pcVar3 = *(code **)(lVar11 + 0x1680);
    pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator->(&(this->m_program).
                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        );
    dVar7 = glu::ShaderProgram::getProgram(pSVar12);
    (*pcVar3)(dVar7);
    pcVar3 = *(code **)(lVar11 + 0xb48);
    pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator->(&(this->m_program).
                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        );
    dVar7 = glu::ShaderProgram::getProgram(pSVar12);
    iVar5 = (*pcVar3)(dVar7,"u_sampler");
    do {
      dVar8 = ::deGetFalse();
      if ((dVar8 != 0) || (iVar5 < 0)) {
        pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar13,(char *)0x0,"samplerUniformLocation >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                   ,0x589);
        __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar8 = ::deGetFalse();
    } while (dVar8 != 0);
    (**(code **)(lVar11 + 0x14f0))(iVar5,0);
    if ((local_11a & 1) != 0) {
      pcVar3 = *(code **)(lVar11 + 0xb48);
      pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::operator->(&(this->m_program).
                              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                            );
      dVar7 = glu::ShaderProgram::getProgram(pSVar12);
      iVar5 = (*pcVar3)(dVar7,"u_viewportSize");
      do {
        dVar8 = ::deGetFalse();
        if ((dVar8 != 0) || (iVar5 < 0)) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,(char *)0x0,"viewportSizeUniformLocation >= 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                     ,0x590);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      pcVar3 = *(code **)(lVar11 + 0x1520);
      iVar6 = tcu::Vector<int,_2>::x
                        ((Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
      iVar9 = tcu::Vector<int,_2>::y
                        ((Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
      (*pcVar3)((float)iVar6,(float)iVar9,iVar5);
    }
    sVar14 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)
                        &attrBindings.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar14 == 8) {
      local_ac8 = &local_5d8;
      do {
        tcu::Vector<float,_2>::Vector(local_ac8);
        local_ac8 = local_ac8 + 1;
      } while (local_ac8 != texCoordVec + 3);
      computeTexCoordVecs<2>
                ((vector<float,_std::allocator<float>_> *)
                 &attrBindings.
                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Vector<float,_2> (*) [4])&local_5d8);
      tcu::TestLog::operator<<
                ((MessageBuilder *)(texCoordVec_1[3].m_data + 1),iterationSection.m_log,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar15 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)(texCoordVec_1[3].m_data + 1),
                           (char (*) [30])"Texture coordinates run from ");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_5d8);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [5])0xf2bd2b);
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,texCoordVec + 2);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(texCoordVec_1[3].m_data + 1));
    }
    else {
      sVar14 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)
                          &attrBindings.
                           super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar14 == 0xc) {
        local_b00 = (Vector<float,_3> *)local_788;
        do {
          tcu::Vector<float,_3>::Vector(local_b00);
          local_b00 = local_b00 + 1;
        } while (local_b00 != (Vector<float,_3> *)(texCoordVec_1[3].m_data + 1));
        computeTexCoordVecs<3>
                  ((vector<float,_std::allocator<float>_> *)
                   &attrBindings.
                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Vector<float,_3> (*) [4])local_788);
        tcu::TestLog::operator<<
                  (&local_908,iterationSection.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar15 = tcu::MessageBuilder::operator<<
                            (&local_908,(char (*) [30])"Texture coordinates run from ");
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(Vector<float,_3> *)local_788);
        pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [5])0xf2bd2b);
        pMVar15 = tcu::MessageBuilder::operator<<
                            (pMVar15,(Vector<float,_3> *)(texCoordVec_1[2].m_data + 1));
        tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_908);
      }
    }
    pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator->(&(this->m_program).
                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        );
    dVar7 = glu::ShaderProgram::getProgram(pSVar12);
    sVar14 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                       ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *
                        )local_438);
    vertexArrays = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                   operator[]((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               *)local_438,0);
    glu::pr::Triangles((PrimitiveList *)&rendered.m_data.m_cap,6,
                       (deUint16 *)&viewportSizeUniformLocation);
    glu::draw(renderCtx_00,dVar7,(int)sVar14,vertexArrays,(PrimitiveList *)&rendered.m_data.m_cap,
              (DrawUtilCallback *)0x0);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               local_438);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &attrBindings.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    getPixels((TextureLevel *)local_948,renderCtx_00,
              (IVec2 *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE,
              &this->m_colorBufferFormat);
    uVar2 = this->m_currentIteration;
    tcu::TextureLevel::getAccess(&local_970,(TextureLevel *)local_948);
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                      (this,(ulong)uVar2,&local_970);
    bVar4 = (((byte)iVar5 ^ 0xff) & 1) != 0;
    if (bVar4) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Result verification failed");
      this_local._4_4_ = STOP;
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_948);
    if (!bVar4) {
      this->m_currentIteration = this->m_currentIteration + 1;
      iVar5 = this->m_currentIteration;
      iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])();
      if (iVar5 == iVar6) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        this_local._4_4_ = STOP;
      }
      else {
        this_local._4_4_ = CONTINUE;
      }
    }
    std::__cxx11::string::~string((string *)local_118);
    tcu::ScopedLogSection::~ScopedLogSection(&local_28);
    return this_local._4_4_;
  }
  if (this->m_currentIteration != 0) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator*(&(this->m_program).
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
    glu::operator<<(pTVar10,pSVar12);
  }
  pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar13,"Failed to build program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
             ,0x561);
  __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TextureGatherCase::IterateResult TextureGatherCase::iterate (void)
{
	TestLog&						log								= m_testCtx.getLog();
	const tcu::ScopedLogSection		iterationSection				(log, "Iteration" + de::toString(m_currentIteration), "Iteration " + de::toString(m_currentIteration));
	const glu::RenderContext&		renderCtx						= m_context.getRenderContext();
	const glw::Functions&			gl								= renderCtx.getFunctions();
	const GatherArgs&				gatherArgs						= getGatherArgs(m_currentIteration);
	const string					refZExpr						= "v_normalizedCoord.x";
	const bool						needPixelCoordInShader			= m_gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool						needNormalizedCoordInShader		= needPixelCoordInShader || isDepthFormat(m_textureFormat);

	// Generate a program appropriate for this iteration.

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(renderCtx, genProgramSources(m_gatherType, m_textureType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange())));
	if (m_currentIteration == 0)
		m_testCtx.getLog() << *m_program;
	else
		m_testCtx.getLog() << TestLog::Message << "Using a program similar to the previous one, except with a gather function call as follows:\n"
											   << genGatherFuncCall(m_gatherType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange(), 0)
											   << TestLog::EndMessage;
	if (!m_program->isOk())
	{
		if (m_currentIteration != 0)
			m_testCtx.getLog() << *m_program;
		TCU_FAIL("Failed to build program");
	}

	// Render.

	gl.viewport(0, 0, RENDER_SIZE.x(), RENDER_SIZE.y());
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const float position[4*2] =
		{
			-1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
		};

		const float normalizedCoord[4*2] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f,
		};

		const vector<float> texCoord = computeQuadTexCoord(m_currentIteration);

		vector<glu::VertexArrayBinding> attrBindings;
		attrBindings.push_back(glu::va::Float("a_position", 2, 4, 0, &position[0]));
		attrBindings.push_back(glu::va::Float("a_texCoord", (int)texCoord.size()/4, 4, 0, &texCoord[0]));
		if (needNormalizedCoordInShader)
			attrBindings.push_back(glu::va::Float("a_normalizedCoord", 2, 4, 0, &normalizedCoord[0]));

		const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

		gl.useProgram(m_program->getProgram());

		{
			const int samplerUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_sampler");
			TCU_CHECK(samplerUniformLocation >= 0);
			gl.uniform1i(samplerUniformLocation, 0);
		}

		if (needPixelCoordInShader)
		{
			const int viewportSizeUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_viewportSize");
			TCU_CHECK(viewportSizeUniformLocation >= 0);
			gl.uniform2f(viewportSizeUniformLocation, (float)RENDER_SIZE.x(), (float)RENDER_SIZE.y());
		}

		if (texCoord.size() == 2*4)
		{
			Vec2 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else if (texCoord.size() == 3*4)
		{
			Vec3 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);

		glu::draw(renderCtx, m_program->getProgram(), (int)attrBindings.size(), &attrBindings[0],
			glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}

	// Verify result.

	{
		const tcu::TextureLevel rendered = getPixels(renderCtx, RENDER_SIZE, m_colorBufferFormat);

		if (!verify(m_currentIteration, rendered.getAccess()))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	m_currentIteration++;
	if (m_currentIteration == (int)getNumIterations())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
		return CONTINUE;
}